

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_peer.cpp
# Opt level: O3

uint32_t libtorrent::aux::peer_priority(endpoint *e1,endpoint *e2)

{
  sa_family_t sVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ulong uVar11;
  ulong uVar12;
  unsigned_short val;
  uint32_t uVar13;
  uint32_t uVar14;
  long lVar15;
  int num_words;
  uint32_t uVar16;
  uint32_t uVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  uint64_t addrbuf;
  bytes_type b2;
  bytes_type b1;
  bad_address_cast local_68;
  char cStack_60;
  char cStack_5f;
  char cStack_5e;
  char cStack_5d;
  char cStack_5c;
  char cStack_5b;
  char cStack_5a;
  char cStack_59;
  char cStack_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  bad_address_cast local_38;
  undefined1 auStack_30 [16];
  undefined8 local_20;
  
  sVar1 = (e1->impl_).data_.base.sa_family;
  if (sVar1 != 2) {
    uVar5 = *(undefined8 *)((long)&(e1->impl_).data_ + 8);
    uVar6 = *(undefined8 *)((long)&(e1->impl_).data_ + 0x10);
    cStack_60 = (char)uVar5;
    cStack_5f = (char)((ulong)uVar5 >> 8);
    cStack_5e = (char)((ulong)uVar5 >> 0x10);
    cStack_5d = (char)((ulong)uVar5 >> 0x18);
    cStack_5c = (char)((ulong)uVar5 >> 0x20);
    cStack_5b = (char)((ulong)uVar5 >> 0x28);
    cStack_5a = (char)((ulong)uVar5 >> 0x30);
    cStack_59 = (char)((ulong)uVar5 >> 0x38);
    cStack_58 = (char)uVar6;
    cStack_57 = (char)((ulong)uVar6 >> 8);
    cStack_56 = (char)((ulong)uVar6 >> 0x10);
    cStack_55 = (char)((ulong)uVar6 >> 0x18);
    cStack_54 = (char)((ulong)uVar6 >> 0x20);
    cStack_53 = (char)((ulong)uVar6 >> 0x28);
    cStack_52 = (char)((ulong)uVar6 >> 0x30);
    cStack_51 = (char)((ulong)uVar6 >> 0x38);
    uVar13 = (e1->impl_).data_.v6.sin6_scope_id;
    uVar14 = 0;
  }
  else {
    uVar14 = (e1->impl_).data_.v6.sin6_flowinfo;
    cStack_60 = '\0';
    cStack_5f = '\0';
    cStack_5e = '\0';
    cStack_5d = '\0';
    cStack_5c = '\0';
    cStack_5b = '\0';
    cStack_5a = '\0';
    cStack_59 = '\0';
    cStack_58 = '\0';
    cStack_57 = '\0';
    cStack_56 = '\0';
    cStack_55 = '\0';
    cStack_54 = '\0';
    cStack_53 = '\0';
    cStack_52 = '\0';
    cStack_51 = '\0';
    uStack_50 = 0;
    uStack_4c = 0;
    uVar13 = 0;
  }
  bVar18 = (e2->impl_).data_.base.sa_family != 2;
  if (bVar18) {
    auStack_30 = *(undefined1 (*) [16])((long)&(e2->impl_).data_ + 8);
    uVar16 = (e2->impl_).data_.v6.sin6_scope_id;
    uVar17 = 0;
  }
  else {
    uVar17 = (e2->impl_).data_.v6.sin6_flowinfo;
    auStack_30 = (undefined1  [16])0x0;
    local_20 = 0;
    uVar16 = 0;
  }
  if ((sVar1 != 2) == bVar18) {
    if (sVar1 != 2) {
      auVar19[0] = -(auStack_30[0] == cStack_60);
      auVar19[1] = -(auStack_30[1] == cStack_5f);
      auVar19[2] = -(auStack_30[2] == cStack_5e);
      auVar19[3] = -(auStack_30[3] == cStack_5d);
      auVar19[4] = -(auStack_30[4] == cStack_5c);
      auVar19[5] = -(auStack_30[5] == cStack_5b);
      auVar19[6] = -(auStack_30[6] == cStack_5a);
      auVar19[7] = -(auStack_30[7] == cStack_59);
      auVar19[8] = -(auStack_30[8] == cStack_58);
      auVar19[9] = -(auStack_30[9] == cStack_57);
      auVar19[10] = -(auStack_30[10] == cStack_56);
      auVar19[0xb] = -(auStack_30[0xb] == cStack_55);
      auVar19[0xc] = -(auStack_30[0xc] == cStack_54);
      auVar19[0xd] = -(auStack_30[0xd] == cStack_53);
      auVar19[0xe] = -(auStack_30[0xe] == cStack_52);
      auVar19[0xf] = -(auStack_30[0xf] == cStack_51);
      if (((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar19[0xf] >> 7) << 0xf) == 0xffff) && (uVar13 == uVar16))
      goto LAB_0036e37d;
LAB_0036e3fb:
      bVar18 = boost::asio::ip::operator>(e1,e2);
      if (bVar18) {
        uVar5 = *(undefined8 *)&(e1->impl_).data_;
        uVar6 = *(undefined8 *)((long)&(e1->impl_).data_ + 8);
        uVar7 = *(undefined8 *)((long)&(e1->impl_).data_ + 0xc);
        uVar8 = *(undefined8 *)((long)&(e1->impl_).data_ + 0x14);
        cStack_58 = (char)((ulong)uVar7 >> 0x20);
        cStack_57 = (char)((ulong)uVar7 >> 0x28);
        cStack_56 = (char)((ulong)uVar7 >> 0x30);
        cStack_55 = (char)((ulong)uVar7 >> 0x38);
        cStack_54 = (char)uVar8;
        cStack_53 = (char)((ulong)uVar8 >> 8);
        cStack_52 = (char)((ulong)uVar8 >> 0x10);
        cStack_51 = (char)((ulong)uVar8 >> 0x18);
        uStack_50 = (undefined4)((ulong)uVar8 >> 0x20);
        cStack_60 = (char)uVar6;
        cStack_5f = (char)((ulong)uVar6 >> 8);
        cStack_5e = (char)((ulong)uVar6 >> 0x10);
        cStack_5d = (char)((ulong)uVar6 >> 0x18);
        cStack_5c = (char)((ulong)uVar6 >> 0x20);
        cStack_5b = (char)((ulong)uVar6 >> 0x28);
        cStack_5a = (char)((ulong)uVar6 >> 0x30);
        cStack_59 = (char)((ulong)uVar6 >> 0x38);
        uVar7 = *(undefined8 *)&(e2->impl_).data_;
        uVar9 = *(undefined8 *)((long)&(e2->impl_).data_ + 8);
        uVar10 = *(undefined8 *)((long)&(e2->impl_).data_ + 0x14);
        *(undefined8 *)((long)&(e1->impl_).data_ + 0xc) =
             *(undefined8 *)((long)&(e2->impl_).data_ + 0xc);
        *(undefined8 *)((long)&(e1->impl_).data_ + 0x14) = uVar10;
        *(undefined8 *)&(e1->impl_).data_ = uVar7;
        *(undefined8 *)((long)&(e1->impl_).data_ + 8) = uVar9;
        *(ulong *)((long)&(e2->impl_).data_ + 0xc) =
             CONCAT17(cStack_55,
                      CONCAT16(cStack_56,
                               CONCAT15(cStack_57,CONCAT14(cStack_58,(int)((ulong)uVar6 >> 0x20)))))
        ;
        *(undefined8 *)((long)&(e2->impl_).data_ + 0x14) = uVar8;
        *(undefined8 *)&(e2->impl_).data_ = uVar5;
        *(undefined8 *)((long)&(e2->impl_).data_ + 8) = uVar6;
      }
      if ((e1->impl_).data_.base.sa_family == 2) {
        local_68 = (bad_address_cast)&PTR__bad_cast_004decf0;
        boost::throw_exception<boost::asio::ip::bad_address_cast>(&local_68);
      }
      uVar11 = *(ulong *)((long)&(e1->impl_).data_ + 8);
      uVar5 = *(undefined8 *)((long)&(e1->impl_).data_ + 0x10);
      auStack_30._0_8_ = uVar5;
      if ((e2->impl_).data_.base.sa_family == 2) {
        local_68 = (bad_address_cast)&PTR__bad_cast_004decf0;
        local_38 = (bad_address_cast)uVar11;
        boost::throw_exception<boost::asio::ip::bad_address_cast>(&local_68);
      }
      uVar12 = *(ulong *)((long)&(e2->impl_).data_ + 8);
      uStack_40 = *(undefined8 *)((long)&(e2->impl_).data_ + 0x10);
      local_38._0_4_ = SUB84(uVar11,0);
      local_48._0_4_ = (int)uVar12;
      if (local_38._0_4_ == (int)local_48) {
        local_38._4_2_ = SUB82(uVar11 >> 0x20,0);
        local_48._4_2_ = (short)(uVar12 >> 0x20);
        lVar15 = (ulong)(local_38._4_2_ == local_48._4_2_ && local_38._0_4_ == (int)local_48) + 1;
      }
      else {
        lVar15 = 0;
      }
      local_68 = (bad_address_cast)(uVar11 & (ulong)peer_priority::v6mask[lVar15]);
      local_48 = uVar12 & (ulong)peer_priority::v6mask[lVar15];
      cStack_60 = (char)uVar5;
      cStack_5f = (char)((ulong)uVar5 >> 8);
      cStack_5e = (char)((ulong)uVar5 >> 0x10);
      cStack_5d = (char)((ulong)uVar5 >> 0x18);
      cStack_5c = (char)((ulong)uVar5 >> 0x20);
      cStack_5b = (char)((ulong)uVar5 >> 0x28);
      cStack_5a = (char)((ulong)uVar5 >> 0x30);
      cStack_59 = (char)((ulong)uVar5 >> 0x38);
      cStack_58 = (char)local_48;
      cStack_57 = (char)(local_48 >> 8);
      cStack_56 = (char)(local_48 >> 0x10);
      cStack_55 = (char)(local_48 >> 0x18);
      cStack_54 = (char)(local_48 >> 0x20);
      cStack_53 = (char)(local_48 >> 0x28);
      cStack_52 = (char)(local_48 >> 0x30);
      cStack_51 = (char)(local_48 >> 0x38);
      uStack_50 = (undefined4)uStack_40;
      uStack_4c = (undefined4)((ulong)uStack_40 >> 0x20);
      num_words = 4;
      local_38 = local_68;
      goto LAB_0036e4f4;
    }
    if (uVar14 == uVar17) {
LAB_0036e37d:
      uVar2 = (e1->impl_).data_.v4.sin_port;
      uVar3 = (e2->impl_).data_.v4.sin_port;
      if ((ushort)(uVar3 << 8 | uVar3 >> 8) < (ushort)(uVar2 << 8 | uVar2 >> 8)) {
        local_68 = *(bad_address_cast *)&(e1->impl_).data_;
        uVar5 = *(undefined8 *)((long)&(e1->impl_).data_ + 8);
        uVar6 = *(undefined8 *)((long)&(e1->impl_).data_ + 0xc);
        uVar7 = *(undefined8 *)((long)&(e1->impl_).data_ + 0x14);
        cStack_58 = (char)((ulong)uVar6 >> 0x20);
        cStack_57 = (char)((ulong)uVar6 >> 0x28);
        cStack_56 = (char)((ulong)uVar6 >> 0x30);
        cStack_55 = (char)((ulong)uVar6 >> 0x38);
        cStack_54 = (char)uVar7;
        cStack_53 = (char)((ulong)uVar7 >> 8);
        cStack_52 = (char)((ulong)uVar7 >> 0x10);
        cStack_51 = (char)((ulong)uVar7 >> 0x18);
        uStack_50 = (undefined4)((ulong)uVar7 >> 0x20);
        cStack_60 = (char)uVar5;
        cStack_5f = (char)((ulong)uVar5 >> 8);
        cStack_5e = (char)((ulong)uVar5 >> 0x10);
        cStack_5d = (char)((ulong)uVar5 >> 0x18);
        cStack_5c = (char)((ulong)uVar5 >> 0x20);
        cStack_5b = (char)((ulong)uVar5 >> 0x28);
        cStack_5a = (char)((ulong)uVar5 >> 0x30);
        cStack_59 = (char)((ulong)uVar5 >> 0x38);
        uVar6 = *(undefined8 *)&(e2->impl_).data_;
        uVar8 = *(undefined8 *)((long)&(e2->impl_).data_ + 8);
        uVar9 = *(undefined8 *)((long)&(e2->impl_).data_ + 0x14);
        *(undefined8 *)((long)&(e1->impl_).data_ + 0xc) =
             *(undefined8 *)((long)&(e2->impl_).data_ + 0xc);
        *(undefined8 *)((long)&(e1->impl_).data_ + 0x14) = uVar9;
        *(undefined8 *)&(e1->impl_).data_ = uVar6;
        *(undefined8 *)((long)&(e1->impl_).data_ + 8) = uVar8;
        *(ulong *)((long)&(e2->impl_).data_ + 0xc) =
             CONCAT17(cStack_55,
                      CONCAT16(cStack_56,
                               CONCAT15(cStack_57,CONCAT14(cStack_58,(int)((ulong)uVar5 >> 0x20)))))
        ;
        *(undefined8 *)((long)&(e2->impl_).data_ + 0x14) = uVar7;
        *(bad_address_cast *)&(e2->impl_).data_ = local_68;
        *(undefined8 *)((long)&(e2->impl_).data_ + 8) = uVar5;
      }
      uVar14 = crc32c_32(addrbuf._4_4_);
      return uVar14;
    }
  }
  else if (sVar1 != 2) goto LAB_0036e3fb;
  bVar18 = boost::asio::ip::operator>(e1,e2);
  if (bVar18) {
    uVar5 = *(undefined8 *)&(e1->impl_).data_;
    uVar6 = *(undefined8 *)((long)&(e1->impl_).data_ + 8);
    uVar7 = *(undefined8 *)((long)&(e1->impl_).data_ + 0xc);
    uVar8 = *(undefined8 *)((long)&(e1->impl_).data_ + 0x14);
    cStack_58 = (char)((ulong)uVar7 >> 0x20);
    cStack_57 = (char)((ulong)uVar7 >> 0x28);
    cStack_56 = (char)((ulong)uVar7 >> 0x30);
    cStack_55 = (char)((ulong)uVar7 >> 0x38);
    cStack_54 = (char)uVar8;
    cStack_53 = (char)((ulong)uVar8 >> 8);
    cStack_52 = (char)((ulong)uVar8 >> 0x10);
    cStack_51 = (char)((ulong)uVar8 >> 0x18);
    uStack_50 = (undefined4)((ulong)uVar8 >> 0x20);
    cStack_60 = (char)uVar6;
    cStack_5f = (char)((ulong)uVar6 >> 8);
    cStack_5e = (char)((ulong)uVar6 >> 0x10);
    cStack_5d = (char)((ulong)uVar6 >> 0x18);
    cStack_5c = (char)((ulong)uVar6 >> 0x20);
    cStack_5b = (char)((ulong)uVar6 >> 0x28);
    cStack_5a = (char)((ulong)uVar6 >> 0x30);
    cStack_59 = (char)((ulong)uVar6 >> 0x38);
    uVar7 = *(undefined8 *)&(e2->impl_).data_;
    uVar9 = *(undefined8 *)((long)&(e2->impl_).data_ + 8);
    uVar10 = *(undefined8 *)((long)&(e2->impl_).data_ + 0x14);
    *(undefined8 *)((long)&(e1->impl_).data_ + 0xc) =
         *(undefined8 *)((long)&(e2->impl_).data_ + 0xc);
    *(undefined8 *)((long)&(e1->impl_).data_ + 0x14) = uVar10;
    *(undefined8 *)&(e1->impl_).data_ = uVar7;
    *(undefined8 *)((long)&(e1->impl_).data_ + 8) = uVar9;
    *(ulong *)((long)&(e2->impl_).data_ + 0xc) =
         CONCAT17(cStack_55,
                  CONCAT16(cStack_56,
                           CONCAT15(cStack_57,CONCAT14(cStack_58,(int)((ulong)uVar6 >> 0x20)))));
    *(undefined8 *)((long)&(e2->impl_).data_ + 0x14) = uVar8;
    *(undefined8 *)&(e2->impl_).data_ = uVar5;
    *(undefined8 *)((long)&(e2->impl_).data_ + 8) = uVar6;
  }
  if ((e1->impl_).data_.base.sa_family != 2) {
    local_68 = (bad_address_cast)&PTR__bad_cast_004decf0;
    boost::throw_exception<boost::asio::ip::bad_address_cast>(&local_68);
  }
  uVar4 = (e1->impl_).data_.v6.sin6_flowinfo;
  local_38._0_4_ = uVar4;
  if ((e2->impl_).data_.base.sa_family != 2) {
    local_68 = (bad_address_cast)&PTR__bad_cast_004decf0;
    boost::throw_exception<boost::asio::ip::bad_address_cast>(&local_68);
  }
  local_68._4_4_ = (e2->impl_).data_.v6.sin6_flowinfo;
  local_38._0_2_ = SUB42(uVar4,0);
  if (local_38._0_2_ == (short)local_68._4_4_) {
    local_38._2_1_ = SUB41(uVar4 >> 0x10,0);
    local_48._2_1_ = (char)((uint)local_68._4_4_ >> 0x10);
    lVar15 = (ulong)(local_38._2_1_ == local_48._2_1_ && local_38._0_2_ == (short)local_68._4_4_) +
             1;
  }
  else {
    lVar15 = 0;
  }
  local_38._0_4_ = uVar4 & (uint)peer_priority::v4mask[lVar15];
  local_68._4_4_ = (uint)peer_priority::v4mask[lVar15] & local_68._4_4_;
  local_48 = CONCAT44(local_48._4_4_,local_68._4_4_);
  local_68._0_4_ = local_38._0_4_;
  num_words = 1;
LAB_0036e4f4:
  uVar14 = crc32c((uint64_t *)&local_68,num_words);
  return uVar14;
}

Assistant:

std::uint32_t peer_priority(tcp::endpoint e1, tcp::endpoint e2)
	{
		TORRENT_ASSERT(aux::is_v4(e1) == aux::is_v4(e2));

		using std::swap;

		std::uint32_t ret;
		if (e1.address() == e2.address())
		{
			if (e1.port() > e2.port())
				swap(e1, e2);
			std::array<char, 4> buf;
			auto ptr = buf.data();
			aux::write_uint16(e1.port(), ptr);
			aux::write_uint16(e2.port(), ptr);
			std::uint32_t p;
			std::memcpy(&p, buf.data(), 4);
			ret = crc32c_32(p);
		}
		else if (aux::is_v6(e1))
		{
			static const std::uint8_t v6mask[][8] = {
				{ 0xff, 0xff, 0xff, 0xff, 0x55, 0x55, 0x55, 0x55 },
				{ 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0x55, 0x55 },
				{ 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff }
			};

			if (e1 > e2) swap(e1, e2);
			address_v6::bytes_type b1 = e1.address().to_v6().to_bytes();
			address_v6::bytes_type b2 = e2.address().to_v6().to_bytes();
			int const mask = std::memcmp(b1.data(), b2.data(), 4) ? 0
				: std::memcmp(b1.data(), b2.data(), 6) ? 1 : 2;
			apply_mask(b1.data(), v6mask[mask], 8);
			apply_mask(b2.data(), v6mask[mask], 8);
			std::uint64_t addrbuf[4];
			std::memcpy(&addrbuf[0], b1.data(), 16);
			std::memcpy(&addrbuf[2], b2.data(), 16);
			ret = aux::crc32c(addrbuf, 4);
		}
		else
		{
			static const std::uint8_t v4mask[][4] = {
				{ 0xff, 0xff, 0x55, 0x55 },
				{ 0xff, 0xff, 0xff, 0x55 },
				{ 0xff, 0xff, 0xff, 0xff }
			};

			if (e1 > e2) swap(e1, e2);
			address_v4::bytes_type b1 = e1.address().to_v4().to_bytes();
			address_v4::bytes_type b2 = e2.address().to_v4().to_bytes();
			int mask = std::memcmp(&b1[0], &b2[0], 2) ? 0
				: std::memcmp(&b1[0], &b2[0], 3) ? 1 : 2;
			apply_mask(&b1[0], v4mask[mask], 4);
			apply_mask(&b2[0], v4mask[mask], 4);
			std::uint64_t addrbuf;
			std::memcpy(&addrbuf, &b1[0], 4);
			std::memcpy(reinterpret_cast<char*>(&addrbuf) + 4, &b2[0], 4);
			ret = aux::crc32c(&addrbuf, 1);
		}

		return ret;
	}